

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_btGetAllMatches_noDict_3
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  long lVar7;
  U32 UVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong *puVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint *puVar19;
  ulong *puVar20;
  uint uVar21;
  ulong *puVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong *puVar31;
  uint uVar32;
  ulong uVar33;
  BYTE *__s1;
  uint uVar34;
  BYTE *pInLoopLimit;
  ulong local_d8;
  ulong local_a0;
  uint *local_88;
  uint local_4c;
  ZSTD_matchState_t *local_48;
  ulong local_40;
  U32 *local_38;
  
  if (3 < (ms->cParams).minMatch) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar5 = (ms->window).base;
  uVar33 = (ulong)ms->nextToUpdate;
  if (ip < pBVar5 + uVar33) {
    return 0;
  }
  while( true ) {
    uVar17 = (uint)uVar33;
    uVar15 = (uint)((long)ip - (long)pBVar5);
    if (uVar15 <= uVar17) break;
    UVar8 = ZSTD_insertBt1(ms,pBVar5 + uVar33,iHighLimit,uVar15,3,0);
    uVar33 = (ulong)(UVar8 + uVar17);
    if (UVar8 + uVar17 <= uVar17) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar5) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar5) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar15;
  uVar15 = (ms->cParams).targetLength;
  uVar17 = 0xfff;
  if (uVar15 < 0xfff) {
    uVar17 = uVar15;
  }
  uVar15 = (ms->cParams).hashLog;
  if (0x20 < uVar15) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  pBVar5 = (ms->window).base;
  uVar34 = (int)ip - (int)pBVar5;
  uVar33 = (ulong)uVar34;
  uVar25 = (uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar15 & 0x1fU);
  uVar24 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar15 = (ms->window).lowLimit;
  uVar9 = uVar34 - uVar24;
  local_d8 = 0;
  if (uVar34 < uVar24) {
    uVar9 = 0;
  }
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar10 = uVar34 - uVar21;
  if (uVar34 - uVar15 <= uVar21) {
    uVar10 = uVar15;
  }
  if (ms->loadedDictEnd != 0) {
    uVar10 = uVar15;
  }
  uVar15 = uVar10 + (uVar10 == 0);
  uVar21 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x819e,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  pUVar6 = ms->hashTable;
  uVar3 = pUVar6[uVar25];
  local_38 = ms->chainTable;
  uVar4 = (ms->window).dictLimit;
  uVar18 = (ulong)((uVar24 & uVar34) * 2);
  local_88 = local_38 + uVar18;
  puVar19 = local_38 + uVar18 + 1;
  uVar16 = uVar34 + 9;
  uVar18 = (ulong)(lengthToBeat - 1);
  puVar31 = (ulong *)(ip + 3);
  puVar1 = (ulong *)(iHighLimit + -7);
  puVar2 = (ulong *)(iHighLimit + -3);
  puVar22 = (ulong *)(iHighLimit + -1);
  uVar23 = (ulong)ll0;
  do {
    if (uVar23 == 3) {
      UVar8 = *rep - 1;
    }
    else {
      UVar8 = rep[uVar23];
    }
    local_48 = ms;
    if (uVar34 < uVar4) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81a5,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (UVar8 - 1 < uVar34 - uVar4) {
      uVar26 = 0;
      if ((uVar10 <= uVar34 - UVar8) &&
         (uVar26 = 0, ((*(uint *)(ip + -(ulong)UVar8) ^ *(uint *)ip) & 0xffffff) == 0)) {
        lVar30 = -(ulong)UVar8;
        puVar20 = (ulong *)((long)puVar31 + lVar30);
        puVar13 = puVar31;
        if (puVar31 < puVar1) {
          if (*puVar20 == *puVar31) {
            lVar30 = lVar30 + 0xb;
            lVar28 = 0;
            do {
              puVar13 = (ulong *)(ip + lVar28 + 0xb);
              if (puVar1 <= puVar13) {
                puVar20 = (ulong *)(ip + lVar28 + lVar30);
                goto LAB_001b2a66;
              }
              lVar7 = lVar28 + lVar30;
              lVar28 = lVar28 + 8;
            } while (*(ulong *)(ip + lVar7) == *puVar13);
            uVar27 = *puVar13 ^ *(ulong *)(ip + lVar7);
            uVar29 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar26 = ((uint)(uVar29 >> 3) & 0x1fffffff) + (int)lVar28;
          }
          else {
            uVar27 = *puVar31 ^ *puVar20;
            uVar29 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar26 = (uint)(uVar29 >> 3) & 0x1fffffff;
          }
        }
        else {
LAB_001b2a66:
          if ((puVar13 < puVar2) && ((int)*puVar20 == (int)*puVar13)) {
            puVar13 = (ulong *)((long)puVar13 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar13 < puVar22) && ((short)*puVar20 == (short)*puVar13)) {
            puVar13 = (ulong *)((long)puVar13 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar13 < iHighLimit) {
            puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar20 == (char)*puVar13));
          }
          uVar26 = (int)puVar13 - (int)puVar31;
        }
        uVar26 = uVar26 + 3;
      }
    }
    else {
      uVar26 = 0;
      if (uVar34 < uVar10) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81b1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
    }
    uVar29 = (ulong)uVar26;
    if (uVar18 < uVar29) {
      matches[local_d8].off = ((int)uVar23 - ll0) + 1;
      matches[local_d8].len = uVar26;
      uVar32 = (int)local_d8 + 1;
      local_d8 = (ulong)uVar32;
      if (uVar17 < uVar26) {
        return uVar32;
      }
      uVar18 = uVar29;
      if (ip + uVar29 == iHighLimit) {
        return uVar32;
      }
    }
    uVar23 = uVar23 + 1;
  } while (ll0 + 3 != (int)uVar23);
  if (((uVar18 < 3) &&
      (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,nextToUpdate3,ip), uVar15 <= UVar8)) &&
     (uVar34 - UVar8 < 0x40000)) {
    uVar23 = (ulong)UVar8;
    puVar20 = (ulong *)(pBVar5 + uVar23);
    puVar31 = (ulong *)ip;
    if (ip < puVar1) {
      if (*puVar20 == *(ulong *)ip) {
        lVar30 = 0;
        do {
          if (puVar1 <= ip + lVar30 + 8) {
            puVar20 = (ulong *)(pBVar5 + lVar30 + uVar23 + 8);
            puVar31 = (ulong *)(ip + lVar30 + 8);
            goto LAB_001b2c3c;
          }
          lVar28 = lVar30 + uVar23 + 8;
          uVar29 = *(ulong *)(ip + lVar30 + 8);
          lVar30 = lVar30 + 8;
        } while (*(ulong *)(pBVar5 + lVar28) == uVar29);
        uVar29 = uVar29 ^ *(ulong *)(pBVar5 + lVar28);
        uVar23 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar30;
      }
      else {
        uVar29 = *(ulong *)ip ^ *puVar20;
        uVar23 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar23 = uVar23 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_001b2c3c:
      if ((puVar31 < puVar2) && ((int)*puVar20 == (int)*puVar31)) {
        puVar31 = (ulong *)((long)puVar31 + 4);
        puVar20 = (ulong *)((long)puVar20 + 4);
      }
      if ((puVar31 < puVar22) && ((short)*puVar20 == (short)*puVar31)) {
        puVar31 = (ulong *)((long)puVar31 + 2);
        puVar20 = (ulong *)((long)puVar20 + 2);
      }
      if (puVar31 < iHighLimit) {
        puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar20 == (char)*puVar31));
      }
      uVar23 = (long)puVar31 - (long)ip;
    }
    if (2 < uVar23) {
      if (uVar34 <= UVar8) {
        __assert_fail("curr > matchIndex3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81de,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((U32)local_d8 != 0) {
        __assert_fail("mnum==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81df,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      matches->off = (uVar34 - UVar8) + 3;
      matches->len = (U32)uVar23;
      local_d8 = 1;
      uVar18 = uVar23;
      if (uVar17 < uVar23 || ip + uVar23 == iHighLimit) {
        UVar8 = uVar34 + 1;
        local_d8._0_4_ = 1;
        goto LAB_001b2d3a;
      }
    }
  }
  pUVar6[uVar25] = uVar34;
  uVar17 = (U32)local_d8;
  if (uVar15 <= uVar3) {
    local_a0 = 0;
    uVar23 = 0;
    local_40 = uVar33;
    uVar25 = uVar16;
    do {
      uVar29 = uVar23;
      if (local_a0 < uVar23) {
        uVar29 = local_a0;
      }
      if ((uint)uVar33 <= uVar3) {
        __assert_fail("curr > matchIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar27 = uVar29 + uVar3;
      if (uVar27 < uVar4) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f4,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      __s1 = pBVar5 + uVar3;
      if ((uVar4 <= uVar3) &&
         (iVar11 = bcmp(__s1,ip,uVar29), uVar33 = local_40, uVar25 = uVar16, iVar11 != 0)) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f6,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      puVar31 = (ulong *)(ip + uVar29);
      puVar20 = (ulong *)(__s1 + uVar29);
      puVar13 = puVar31;
      if (puVar31 < puVar1) {
        if (*puVar20 == *puVar31) {
          lVar30 = 0;
          do {
            puVar13 = (ulong *)(ip + lVar30 + uVar29 + 8);
            if (puVar1 <= puVar13) {
              puVar20 = (ulong *)(pBVar5 + uVar27 + lVar30 + 8);
              goto LAB_001b2ebe;
            }
            lVar28 = lVar30 + uVar27 + 8;
            lVar30 = lVar30 + 8;
          } while (*(ulong *)(pBVar5 + lVar28) == *puVar13);
          uVar12 = *puVar13 ^ *(ulong *)(pBVar5 + lVar28);
          uVar27 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar30;
        }
        else {
          uVar12 = *puVar31 ^ *puVar20;
          uVar27 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          uVar27 = uVar27 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001b2ebe:
        if ((puVar13 < puVar2) && ((int)*puVar20 == (int)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 4);
          puVar20 = (ulong *)((long)puVar20 + 4);
        }
        if ((puVar13 < puVar22) && ((short)*puVar20 == (short)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 2);
          puVar20 = (ulong *)((long)puVar20 + 2);
        }
        if (puVar13 < iHighLimit) {
          puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar20 == (char)*puVar13));
        }
        uVar27 = (long)puVar13 - (long)puVar31;
      }
      uVar27 = uVar27 + uVar29;
      if (uVar18 < uVar27) {
        uVar17 = uVar16 - uVar3;
        if (uVar16 < uVar3 || uVar17 == 0) {
          __assert_fail("matchEndIdx > matchIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8203,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar16 = uVar25;
        if (uVar17 < uVar27) {
          uVar16 = uVar3 + (U32)uVar27;
        }
        matches[local_d8].off = (uVar34 + 3) - uVar3;
        matches[local_d8].len = (U32)uVar27;
        uVar17 = (int)local_d8 + 1;
        local_d8 = (ulong)uVar17;
        if ((0x1000 < uVar27) || (uVar18 = uVar27, uVar25 = uVar16, ip + uVar27 == iHighLimit))
        break;
      }
      puVar14 = local_38 + (uVar3 & uVar24) * 2;
      uVar17 = (U32)local_d8;
      if (__s1[uVar27] < ip[uVar27]) {
        *local_88 = uVar3;
        if (uVar3 <= uVar9) {
          local_88 = &local_4c;
          break;
        }
        puVar14 = puVar14 + 1;
        local_a0 = uVar27;
        local_88 = puVar14;
      }
      else {
        *puVar19 = uVar3;
        puVar19 = puVar14;
        uVar23 = uVar27;
        if (uVar3 <= uVar9) {
          puVar19 = &local_4c;
          break;
        }
      }
      uVar21 = uVar21 - 1;
      if ((uVar21 == 0) || (uVar3 = *puVar14, uVar3 < uVar15)) break;
    } while( true );
  }
  local_d8._0_4_ = uVar17;
  *puVar19 = 0;
  *local_88 = 0;
  if (0x40000000 < uVar21) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8221,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  if (uVar16 <= uVar34 + 8) {
    __assert_fail("matchEndIdx > curr+8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8248,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  UVar8 = uVar16 - 8;
LAB_001b2d3a:
  local_48->nextToUpdate = UVar8;
  return (U32)local_d8;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}